

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

SyntaxGroup metaf::getSyntaxGroup(Group *group)

{
  bool bVar1;
  Type TVar2;
  add_pointer_t<const_metaf::KeywordGroup> this;
  add_pointer_t<const_metaf::LocationGroup> ptVar3;
  add_pointer_t<const_metaf::ReportTimeGroup> ptVar4;
  add_pointer_t<const_metaf::TrendGroup> ptVar5;
  add_pointer_t<const_metaf::TrendGroup> trendGroup;
  add_pointer_t<const_metaf::KeywordGroup> keywordGroup;
  SyntaxGroup local_4;
  
  this = std::
         get_if<metaf::KeywordGroup,metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
                   ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                     *)0x23d363);
  if (this == (add_pointer_t<const_metaf::KeywordGroup>)0x0) {
    ptVar3 = std::
             get_if<metaf::LocationGroup,metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
                       ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                         *)0x23d42a);
    if (ptVar3 == (add_pointer_t<const_metaf::LocationGroup>)0x0) {
      ptVar4 = std::
               get_if<metaf::ReportTimeGroup,metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
                         ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                           *)0x23d444);
      if (ptVar4 == (add_pointer_t<const_metaf::ReportTimeGroup>)0x0) {
        ptVar5 = std::
                 get_if<metaf::TrendGroup,metaf::KeywordGroup,metaf::LocationGroup,metaf::ReportTimeGroup,metaf::TrendGroup,metaf::WindGroup,metaf::VisibilityGroup,metaf::CloudGroup,metaf::WeatherGroup,metaf::TemperatureGroup,metaf::PressureGroup,metaf::RunwayStateGroup,metaf::SeaSurfaceGroup,metaf::MinMaxTemperatureGroup,metaf::PrecipitationGroup,metaf::LayerForecastGroup,metaf::PressureTendencyGroup,metaf::CloudTypesGroup,metaf::LowMidHighCloudGroup,metaf::LightningGroup,metaf::VicinityGroup,metaf::MiscGroup,metaf::UnknownGroup>
                           ((variant<metaf::KeywordGroup,_metaf::LocationGroup,_metaf::ReportTimeGroup,_metaf::TrendGroup,_metaf::WindGroup,_metaf::VisibilityGroup,_metaf::CloudGroup,_metaf::WeatherGroup,_metaf::TemperatureGroup,_metaf::PressureGroup,_metaf::RunwayStateGroup,_metaf::SeaSurfaceGroup,_metaf::MinMaxTemperatureGroup,_metaf::PrecipitationGroup,_metaf::LayerForecastGroup,_metaf::PressureTendencyGroup,_metaf::CloudTypesGroup,_metaf::LowMidHighCloudGroup,_metaf::LightningGroup,_metaf::VicinityGroup,_metaf::MiscGroup,_metaf::UnknownGroup>
                             *)0x23d45e);
        if (ptVar5 == (add_pointer_t<const_metaf::TrendGroup>)0x0) {
          local_4 = OTHER;
        }
        else {
          bVar1 = TrendGroup::isTimeSpanGroup((TrendGroup *)group);
          if (bVar1) {
            local_4 = TIME_SPAN;
          }
          else {
            local_4 = OTHER;
          }
        }
      }
      else {
        local_4 = REPORT_TIME;
      }
    }
    else {
      local_4 = LOCATION;
    }
  }
  else {
    TVar2 = KeywordGroup::type(this);
    switch(TVar2) {
    case METAR:
      local_4 = METAR;
      break;
    case SPECI:
      local_4 = SPECI;
      break;
    case TAF:
      local_4 = TAF;
      break;
    case AMD:
      local_4 = AMD;
      break;
    case NIL:
      local_4 = NIL;
      break;
    case CNL:
      local_4 = CNL;
      break;
    case COR:
      local_4 = COR;
      break;
    default:
      local_4 = OTHER;
      break;
    case RMK:
      local_4 = RMK;
      break;
    case MAINTENANCE_INDICATOR:
      local_4 = MAINTENANCE_INDICATOR;
    }
  }
  return local_4;
}

Assistant:

SyntaxGroup getSyntaxGroup(const Group & group) {
	if (auto keywordGroup = std::get_if<KeywordGroup>(&group)) {
		switch (keywordGroup->type()) {
			case KeywordGroup::Type::METAR:	return SyntaxGroup::METAR;
			case KeywordGroup::Type::SPECI:	return SyntaxGroup::SPECI;
			case KeywordGroup::Type::TAF:	return SyntaxGroup::TAF;
			case KeywordGroup::Type::COR:	return SyntaxGroup::COR;
			case KeywordGroup::Type::AMD:	return SyntaxGroup::AMD;
			case KeywordGroup::Type::NIL:	return SyntaxGroup::NIL;
			case KeywordGroup::Type::CNL:	return SyntaxGroup::CNL;
			case KeywordGroup::Type::RMK:	return SyntaxGroup::RMK;

			case KeywordGroup::Type::MAINTENANCE_INDICATOR:
			return SyntaxGroup::MAINTENANCE_INDICATOR;

			default:						return SyntaxGroup::OTHER;
		}
	}
	if (std::get_if<LocationGroup>(&group)) return SyntaxGroup::LOCATION;
	if (std::get_if<ReportTimeGroup>(&group)) return SyntaxGroup::REPORT_TIME;
	if (auto trendGroup = std::get_if<TrendGroup>(&group)) {
		if (trendGroup->isTimeSpanGroup()) return SyntaxGroup::TIME_SPAN;
		return SyntaxGroup::OTHER;
	}
	return SyntaxGroup::OTHER;
}